

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O2

int pmbtoken_exp2_hash_s(EC_GROUP *group,EC_JACOBIAN *out,EC_AFFINE *t,uint8_t *s)

{
  int iVar1;
  uint8_t *orig_ptr;
  uint uVar2;
  uint8_t *buf;
  size_t len;
  CBB cbb;
  uint8_t kHashSLabel [30];
  
  builtin_memcpy(kHashSLabel + 0x10,"ment V2 HashS",0xe);
  builtin_memcpy(kHashSLabel,"PMBTokens Experi",0x10);
  buf = (uint8_t *)0x0;
  iVar1 = CBB_init(&cbb,0);
  uVar2 = 0;
  orig_ptr = (uint8_t *)0x0;
  if (iVar1 != 0) {
    iVar1 = point_to_cbb(&cbb,group,t);
    if (iVar1 == 0) {
      orig_ptr = (uint8_t *)0x0;
      uVar2 = 0;
    }
    else {
      iVar1 = CBB_add_bytes(&cbb,s,0x40);
      uVar2 = 0;
      if (iVar1 == 0) {
        orig_ptr = (uint8_t *)0x0;
      }
      else {
        iVar1 = CBB_finish(&cbb,&buf,&len);
        orig_ptr = buf;
        if (iVar1 != 0) {
          iVar1 = ec_hash_to_curve_p384_xmd_sha512_sswu_draft07(group,out,kHashSLabel,0x1e,buf,len);
          uVar2 = (uint)(iVar1 != 0);
          orig_ptr = buf;
        }
      }
    }
  }
  OPENSSL_free(orig_ptr);
  CBB_cleanup(&cbb);
  return uVar2;
}

Assistant:

static int pmbtoken_exp2_hash_s(const EC_GROUP *group, EC_JACOBIAN *out,
                                const EC_AFFINE *t,
                                const uint8_t s[TRUST_TOKEN_NONCE_SIZE]) {
  const uint8_t kHashSLabel[] = "PMBTokens Experiment V2 HashS";
  int ret = 0;
  CBB cbb;
  uint8_t *buf = NULL;
  size_t len;
  if (!CBB_init(&cbb, 0) || !point_to_cbb(&cbb, group, t) ||
      !CBB_add_bytes(&cbb, s, TRUST_TOKEN_NONCE_SIZE) ||
      !CBB_finish(&cbb, &buf, &len) ||
      !ec_hash_to_curve_p384_xmd_sha512_sswu_draft07(
          group, out, kHashSLabel, sizeof(kHashSLabel), buf, len)) {
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(buf);
  CBB_cleanup(&cbb);
  return ret;
}